

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aarect.h
# Opt level: O2

long __thiscall xz_rect::random(xz_rect *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *in_RDX;
  long in_RSI;
  double dVar8;
  double dVar9;
  
  dVar1 = *(double *)(in_RSI + 0x18);
  dVar2 = *(double *)(in_RSI + 0x20);
  dVar8 = random_double();
  dVar3 = *(double *)(in_RSI + 0x28);
  dVar4 = *(double *)(in_RSI + 0x30);
  dVar5 = *(double *)(in_RSI + 0x38);
  dVar9 = random_double();
  dVar6 = in_RDX[2];
  dVar7 = in_RDX[1];
  (this->super_hittable)._vptr_hittable =
       (_func_int **)((dVar8 * (dVar2 - dVar1) + dVar1) - *in_RDX);
  (this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(dVar5 - dVar7);
  (this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((dVar9 * (dVar4 - dVar3) + dVar3) - dVar6);
  return (long)this;
}

Assistant:

virtual vec3 random(const vec3& origin) const override {
        auto random_point = vec3(random_double(x0,x1), k, random_double(z0,z1));
        return random_point - origin;
    }